

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkStrash(Abc_Ntk_t *pNtk,int fAllNodes,int fCleanup,int fRecord)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    if (pNtk->ntkType != ABC_NTK_STRASH) {
      __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                    ,0x10d,"Abc_Ntk_t *Abc_NtkStrash(Abc_Ntk_t *, int, int, int)");
    }
    pAVar2 = Abc_NtkRestrash(pNtk,fCleanup);
    return pAVar2;
  }
  iVar1 = Abc_NtkToAig(pNtk);
  if (iVar1 == 0) {
    puts("Converting to AIGs has failed.");
  }
  else {
    pAVar2 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    Abc_NtkStrashPerform(pNtk,pAVar2,fAllNodes,fRecord);
    Abc_NtkFinalize(pNtk,pAVar2);
    if (pNtk->vNameIds != (Vec_Int_t *)0x0) {
      Abc_NtkTransferNameIds(pNtk,pAVar2);
    }
    if (fCleanup != 0) {
      Abc_AigCleanup((Abc_Aig_t *)pAVar2->pManFunc);
    }
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar3 = Abc_NtkStrash(pNtk->pExdc,fAllNodes,fCleanup,fRecord);
      pAVar2->pExdc = pAVar3;
    }
    iVar1 = Abc_NtkCheck(pAVar2);
    if (iVar1 != 0) {
      return pAVar2;
    }
    puts("Abc_NtkStrash: The network check has failed.");
    Abc_NtkDelete(pAVar2);
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkStrash( Abc_Ntk_t * pNtk, int fAllNodes, int fCleanup, int fRecord )
{
    Abc_Ntk_t * pNtkAig;
    int nNodes;
    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk) );
    // consider the special case when the network is already structurally hashed
    if ( Abc_NtkIsStrash(pNtk) )
        return Abc_NtkRestrash( pNtk, fCleanup );
    // convert the node representation in the logic network to the AIG form
    if ( !Abc_NtkToAig(pNtk) )
    {
        printf( "Converting to AIGs has failed.\n" );
        return NULL;
    }
    // perform strashing
//    Abc_NtkCleanCopy( pNtk );
    pNtkAig = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    Abc_NtkStrashPerform( pNtk, pNtkAig, fAllNodes, fRecord );
    Abc_NtkFinalize( pNtk, pNtkAig );
    // transfer name IDs
    if ( pNtk->vNameIds )
        Abc_NtkTransferNameIds( pNtk, pNtkAig );
    // print warning about self-feed latches
//    if ( Abc_NtkCountSelfFeedLatches(pNtkAig) )
//        printf( "Warning: The network has %d self-feeding latches.\n", Abc_NtkCountSelfFeedLatches(pNtkAig) );
    // perform cleanup if requested
    nNodes = fCleanup? Abc_AigCleanup((Abc_Aig_t *)pNtkAig->pManFunc) : 0;
//    if ( nNodes )
//        printf( "Warning: AIG cleanup removed %d nodes (this is not a bug).\n", nNodes );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        pNtkAig->pExdc = Abc_NtkStrash( pNtk->pExdc, fAllNodes, fCleanup, fRecord );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
    return pNtkAig;
}